

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_select(jit_State *J,RecordFFData *rd)

{
  int32_t iVar1;
  TRef TVar2;
  TRef *pTVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  TVar2 = *J->base;
  if (TVar2 != 0) {
    iVar1 = lj_ffrecord_select_mode(J,TVar2,rd->argv);
    if (iVar1 == 0) {
      TVar2 = lj_ir_kint(J,J->maxslot - 1);
      *J->base = TVar2;
    }
    else {
      if ((short)TVar2 < 0) {
        recff_nyi(J,rd);
        return;
      }
      uVar4 = (ulong)iVar1;
      uVar6 = (ulong)J->maxslot;
      uVar5 = uVar4;
      if ((long)uVar6 <= (long)uVar4) {
        uVar5 = uVar6;
      }
      if (iVar1 < 0) {
        uVar5 = uVar6 + uVar4;
      }
      if (0 < (long)uVar5) {
        lVar7 = uVar6 - uVar5;
        rd->nres = lVar7;
        if (lVar7 != 0 && (long)uVar5 <= (long)uVar6) {
          pTVar3 = J->base;
          do {
            *pTVar3 = pTVar3[uVar5];
            pTVar3 = pTVar3 + 1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
      }
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_select(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    ptrdiff_t start = lj_ffrecord_select_mode(J, tr, &rd->argv[0]);
    if (start == 0) {  /* select('#', ...) */
      J->base[0] = lj_ir_kint(J, J->maxslot - 1);
    } else if (tref_isk(tr)) {  /* select(k, ...) */
      ptrdiff_t n = (ptrdiff_t)J->maxslot;
      if (start < 0) start += n;
      else if (start > n) start = n;
      if (start >= 1) {
	ptrdiff_t i;
	rd->nres = n - start;
	for (i = 0; i < n - start; i++)
	  J->base[i] = J->base[start+i];
      }  /* else: Interpreter will throw. */
    } else {
      recff_nyiu(J, rd);
      return;
    }
  }  /* else: Interpreter will throw. */
}